

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

int imagetobmp(opj_image_t *image,char *outfile)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__s;
  opj_image_comp_t *poVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  
  poVar5 = image->comps;
  uVar12 = poVar5->prec;
  if (uVar12 < 8) {
    fprintf(_stderr,"imagetobmp: Unsupported precision: %d\n");
LAB_0010ba4c:
    iVar6 = 1;
  }
  else {
    if ((((((image->numcomps < 3) || (poVar5->dx != poVar5[1].dx)) || (poVar5->dx != poVar5[2].dx))
         || ((poVar5->dy != poVar5[1].dy || (poVar5->dy != poVar5[2].dy)))) ||
        ((uVar12 != poVar5[1].prec ||
         ((uVar12 != poVar5[2].prec || (poVar5->sgnd != poVar5[1].sgnd)))))) ||
       (poVar5->sgnd != poVar5[2].sgnd)) {
      __s = fopen(outfile,"wb");
      if (__s == (FILE *)0x0) goto LAB_0010ba31;
      if (1 < image->numcomps) {
        fprintf(_stderr,"imagetobmp: only first component of %d is used.\n");
      }
      uVar12 = image->comps->w;
      uVar1 = image->comps->h;
      fwrite("BM",2,1,__s);
      iVar2 = uVar1 * uVar12;
      iVar6 = uVar1 * ((int)uVar12 % 2);
      uVar13 = iVar6 + iVar2 + 0x436;
      fprintf(__s,"%c%c%c%c",(ulong)(uVar13 & 0xff),(ulong)(uVar13 >> 8 & 0xff),
              (ulong)(uVar13 >> 0x10 & 0xff),
              (ulong)(((int)uVar12 % 2) * uVar12 + iVar2 + 0x436 >> 0x18));
      fprintf(__s,"%c%c%c%c",0,0,0,0);
      fprintf(__s,"%c%c%c%c",0x36,4,0,0);
      fprintf(__s,"%c%c%c%c",0x28,0,0,0);
      fprintf(__s,"%c%c%c%c",(ulong)(uVar12 & 0xff),(ulong)(uVar12 >> 8 & 0xff),
              (ulong)(uVar12 >> 0x10 & 0xff),(ulong)(uVar12 >> 0x18));
      fprintf(__s,"%c%c%c%c",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
              (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18));
      fprintf(__s,"%c%c",1,0);
      fprintf(__s,"%c%c",8,0);
      fprintf(__s,"%c%c%c%c",0,0,0,0);
      uVar13 = iVar6 + iVar2;
      fprintf(__s,"%c%c%c%c",(ulong)(uVar13 & 0xff),(ulong)(uVar13 >> 8 & 0xff),
              (ulong)(uVar13 >> 0x10 & 0xff),(ulong)(uVar13 >> 0x18));
      fprintf(__s,"%c%c%c%c",0x9a,0x1e,0,0);
      fprintf(__s,"%c%c%c%c",0x9a,0x1e,0,0);
      fprintf(__s,"%c%c%c%c",0,1,0,0);
      fprintf(__s,"%c%c%c%c",0,1,0,0);
      uVar13 = image->comps->prec;
      iVar6 = 0;
      if (8 < uVar13) {
        iVar6 = uVar13 - 8;
        printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n");
      }
      uVar10 = 0;
      do {
        fprintf(__s,"%c%c%c%c",uVar10,uVar10,uVar10,0);
        uVar13 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar13;
      } while (uVar13 != 0x100);
      if (0 < iVar2) {
        iVar15 = 0;
        do {
          poVar5 = image->comps;
          iVar16 = 0;
          if (poVar5->sgnd != 0) {
            iVar16 = 1 << ((char)poVar5->prec - 1U & 0x1f);
          }
          uVar13 = iVar16 + poVar5->data
                            [(int)((~(iVar15 / (int)uVar12) + uVar1) * uVar12 + iVar15 % (int)uVar12
                                  )];
          if (0 < iVar6) {
            iVar16 = (int)uVar13 >> ((byte)iVar6 - 1 & 0x1f);
            uVar13 = (iVar16 - (iVar16 - ((int)uVar13 >> 0x1f) & 0xfffffffeU)) +
                     ((int)uVar13 >> ((byte)iVar6 & 0x1f));
          }
          uVar14 = 0;
          if (0 < (int)uVar13) {
            uVar14 = uVar13;
          }
          uVar14 = uVar14 & 0xff;
          if (0xff < (int)uVar13) {
            uVar14 = 0xff;
          }
          fputc(uVar14,__s);
          iVar15 = iVar15 + 1;
          uVar13 = 5 - (int)uVar12 % 4;
          if (iVar15 % (int)uVar12 == 0 && (int)uVar12 % 4 != 0) {
            do {
              fputc(0,__s);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
        } while (iVar15 != iVar2);
      }
    }
    else {
      __s = fopen(outfile,"wb");
      if (__s == (FILE *)0x0) {
LAB_0010ba31:
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        goto LAB_0010ba4c;
      }
      uVar1 = image->comps->w;
      uVar13 = image->comps->h;
      fwrite("BM",2,1,__s);
      iVar2 = uVar13 * uVar1;
      iVar6 = uVar13 * 3 * ((int)uVar1 % 2);
      uVar12 = iVar2 * 3 + iVar6;
      uVar14 = iVar6 + iVar2 * 3 + 0x36;
      fprintf(__s,"%c%c%c%c",(ulong)(uVar14 & 0xff),(ulong)(uVar14 >> 8 & 0xff),
              (ulong)(uVar14 >> 0x10 & 0xff),(ulong)(uVar14 >> 0x18));
      fprintf(__s,"%c%c%c%c",0,0,0,0);
      fprintf(__s,"%c%c%c%c",0x36,0,0,0);
      fprintf(__s,"%c%c%c%c",0x28,0,0,0);
      fprintf(__s,"%c%c%c%c",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
              (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18));
      fprintf(__s,"%c%c%c%c",(ulong)(uVar13 & 0xff),(ulong)(uVar13 >> 8 & 0xff),
              (ulong)(uVar13 >> 0x10 & 0xff),(ulong)(uVar13 >> 0x18));
      fprintf(__s,"%c%c",1,0);
      fprintf(__s,"%c%c",0x18,0);
      fprintf(__s,"%c%c%c%c",0,0,0,0);
      fprintf(__s,"%c%c%c%c",(ulong)(((int)uVar1 % 2 + uVar1) * uVar13 * 3 & 0xff),
              (ulong)(uVar12 >> 8 & 0xff),(ulong)(uVar12 >> 0x10 & 0xff));
      fprintf(__s,"%c%c%c%c",0x9a,0x1e,0);
      fprintf(__s,"%c%c%c%c",0x9a,0x1e,0);
      fprintf(__s,"%c%c%c%c",0,0,0);
      fprintf(__s,"%c%c%c%c",0,0,0);
      poVar5 = image->comps;
      iVar6 = 0;
      if (8 < poVar5->prec) {
        iVar6 = poVar5->prec - 8;
        printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n");
        poVar5 = image->comps;
      }
      iVar15 = 0;
      if (8 < poVar5[1].prec) {
        iVar15 = poVar5[1].prec - 8;
        printf("BMP CONVERSION: Truncating component 1 from %d bits to 8 bits\n");
        poVar5 = image->comps;
      }
      iVar16 = 0;
      if (8 < poVar5[2].prec) {
        iVar16 = poVar5[2].prec - 8;
        printf("BMP CONVERSION: Truncating component 2 from %d bits to 8 bits\n");
      }
      if (0 < iVar2) {
        uVar12 = uVar1 * 3;
        uVar14 = uVar1 * 3 + 3;
        if (-1 < (int)uVar12) {
          uVar14 = uVar12;
        }
        iVar7 = uVar12 - (uVar14 & 0xfffffffc);
        iVar9 = 0;
        do {
          poVar5 = image->comps;
          iVar11 = 0;
          if (poVar5->sgnd != 0) {
            iVar11 = 1 << ((char)poVar5->prec - 1U & 0x1f);
          }
          iVar3 = (~(iVar9 / (int)uVar1) + uVar13) * uVar1 + iVar9 % (int)uVar1;
          uVar12 = iVar11 + poVar5->data[iVar3];
          if (0 < iVar6) {
            iVar11 = (int)uVar12 >> ((byte)iVar6 - 1 & 0x1f);
            uVar12 = (iVar11 - (iVar11 - ((int)uVar12 >> 0x1f) & 0xfffffffeU)) +
                     ((int)uVar12 >> ((byte)iVar6 & 0x1f));
          }
          iVar11 = 0;
          uVar14 = 0;
          if (0 < (int)uVar12) {
            uVar14 = uVar12;
          }
          uVar14 = uVar14 & 0xff;
          if (0xff < (int)uVar12) {
            uVar14 = 0xff;
          }
          if (poVar5[1].sgnd != 0) {
            iVar11 = 1 << ((char)poVar5[1].prec - 1U & 0x1f);
          }
          uVar12 = iVar11 + poVar5[1].data[iVar3];
          if (0 < iVar15) {
            iVar11 = (int)uVar12 >> ((byte)iVar15 - 1 & 0x1f);
            uVar12 = (iVar11 - (iVar11 - ((int)uVar12 >> 0x1f) & 0xfffffffeU)) +
                     ((int)uVar12 >> ((byte)iVar15 & 0x1f));
          }
          iVar11 = 0;
          uVar4 = 0;
          if (0 < (int)uVar12) {
            uVar4 = uVar12;
          }
          uVar4 = uVar4 & 0xff;
          if (0xff < (int)uVar12) {
            uVar4 = 0xff;
          }
          if (poVar5[2].sgnd != 0) {
            iVar11 = 1 << ((char)poVar5[2].prec - 1U & 0x1f);
          }
          uVar12 = iVar11 + poVar5[2].data[iVar3];
          if (0 < iVar16) {
            iVar11 = (int)uVar12 >> ((byte)iVar16 - 1 & 0x1f);
            uVar12 = (iVar11 - (iVar11 - ((int)uVar12 >> 0x1f) & 0xfffffffeU)) +
                     ((int)uVar12 >> ((byte)iVar16 & 0x1f));
          }
          uVar8 = 0;
          if (0 < (int)uVar12) {
            uVar8 = uVar12;
          }
          uVar8 = uVar8 & 0xff;
          if (0xff < (int)uVar12) {
            uVar8 = 0xff;
          }
          fprintf(__s,"%c%c%c",(ulong)uVar8,(ulong)uVar4,(ulong)uVar14);
          iVar9 = iVar9 + 1;
          uVar12 = 5 - iVar7;
          if (iVar9 % (int)uVar1 == 0 && iVar7 != 0) {
            do {
              fputc(0,__s);
              uVar12 = uVar12 - 1;
            } while (1 < uVar12);
          }
        } while (iVar9 != iVar2);
      }
    }
    fclose(__s);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int imagetobmp(opj_image_t * image, const char *outfile)
{
    int w, h;
    int i, pad;
    FILE *fdest = NULL;
    int adjustR, adjustG, adjustB;

    if (image->comps[0].prec < 8) {
        fprintf(stderr, "imagetobmp: Unsupported precision: %d\n",
                image->comps[0].prec);
        return 1;
    }
    if (image->numcomps >= 3 && image->comps[0].dx == image->comps[1].dx
            && image->comps[1].dx == image->comps[2].dx
            && image->comps[0].dy == image->comps[1].dy
            && image->comps[1].dy == image->comps[2].dy
            && image->comps[0].prec == image->comps[1].prec
            && image->comps[1].prec == image->comps[2].prec
            && image->comps[0].sgnd == image->comps[1].sgnd
            && image->comps[1].sgnd == image->comps[2].sgnd) {

        /* -->> -->> -->> -->>
        24 bits color
        <<-- <<-- <<-- <<-- */

        fdest = fopen(outfile, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return 1;
        }

        w = (int)image->comps[0].w;
        h = (int)image->comps[0].h;

        fprintf(fdest, "BM");

        /* FILE HEADER */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c",
                (OPJ_UINT8)(h * w * 3 + 3 * h * (w % 2) + 54) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2) + 54) >> 8) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2) + 54) >> 16) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2) + 54) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (54) & 0xff, ((54) >> 8) & 0xff, ((54) >> 16) & 0xff,
                ((54) >> 24) & 0xff);

        /* INFO HEADER   */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c", (40) & 0xff, ((40) >> 8) & 0xff, ((40) >> 16) & 0xff,
                ((40) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((w) & 0xff),
                (OPJ_UINT8)((w) >> 8) & 0xff,
                (OPJ_UINT8)((w) >> 16) & 0xff,
                (OPJ_UINT8)((w) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((h) & 0xff),
                (OPJ_UINT8)((h) >> 8) & 0xff,
                (OPJ_UINT8)((h) >> 16) & 0xff,
                (OPJ_UINT8)((h) >> 24) & 0xff);
        fprintf(fdest, "%c%c", (1) & 0xff, ((1) >> 8) & 0xff);
        fprintf(fdest, "%c%c", (24) & 0xff, ((24) >> 8) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)(3 * h * w + 3 * h * (w % 2)) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2)) >> 8) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2)) >> 16) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2)) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);

        if (image->comps[0].prec > 8) {
            adjustR = (int)image->comps[0].prec - 8;
            printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n",
                   image->comps[0].prec);
        } else {
            adjustR = 0;
        }
        if (image->comps[1].prec > 8) {
            adjustG = (int)image->comps[1].prec - 8;
            printf("BMP CONVERSION: Truncating component 1 from %d bits to 8 bits\n",
                   image->comps[1].prec);
        } else {
            adjustG = 0;
        }
        if (image->comps[2].prec > 8) {
            adjustB = (int)image->comps[2].prec - 8;
            printf("BMP CONVERSION: Truncating component 2 from %d bits to 8 bits\n",
                   image->comps[2].prec);
        } else {
            adjustB = 0;
        }

        for (i = 0; i < w * h; i++) {
            OPJ_UINT8 rc, gc, bc;
            int r, g, b;

            r = image->comps[0].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            r += (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
            if (adjustR > 0) {
                r = ((r >> adjustR) + ((r >> (adjustR - 1)) % 2));
            }
            if (r > 255) {
                r = 255;
            } else if (r < 0) {
                r = 0;
            }
            rc = (OPJ_UINT8)r;

            g = image->comps[1].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            g += (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            if (adjustG > 0) {
                g = ((g >> adjustG) + ((g >> (adjustG - 1)) % 2));
            }
            if (g > 255) {
                g = 255;
            } else if (g < 0) {
                g = 0;
            }
            gc = (OPJ_UINT8)g;

            b = image->comps[2].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            b += (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
            if (adjustB > 0) {
                b = ((b >> adjustB) + ((b >> (adjustB - 1)) % 2));
            }
            if (b > 255) {
                b = 255;
            } else if (b < 0) {
                b = 0;
            }
            bc = (OPJ_UINT8)b;

            fprintf(fdest, "%c%c%c", bc, gc, rc);

            if ((i + 1) % w == 0) {
                for (pad = ((3 * w) % 4) ? (4 - (3 * w) % 4) : 0; pad > 0; pad--) { /* ADD */
                    fprintf(fdest, "%c", 0);
                }
            }
        }
        fclose(fdest);
    } else {            /* Gray-scale */

        /* -->> -->> -->> -->>
        8 bits non code (Gray scale)
        <<-- <<-- <<-- <<-- */

        fdest = fopen(outfile, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return 1;
        }
        if (image->numcomps > 1) {
            fprintf(stderr, "imagetobmp: only first component of %d is used.\n",
                    image->numcomps);
        }
        w = (int)image->comps[0].w;
        h = (int)image->comps[0].h;

        fprintf(fdest, "BM");

        /* FILE HEADER */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)(h * w + 54 + 1024 + h * (w % 2)) & 0xff,
                (OPJ_UINT8)((h * w + 54 + 1024 + h * (w % 2)) >> 8) & 0xff,
                (OPJ_UINT8)((h * w + 54 + 1024 + h * (w % 2)) >> 16) & 0xff,
                (OPJ_UINT8)((h * w + 54 + 1024 + w * (w % 2)) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (54 + 1024) & 0xff, ((54 + 1024) >> 8) & 0xff,
                ((54 + 1024) >> 16) & 0xff,
                ((54 + 1024) >> 24) & 0xff);

        /* INFO HEADER */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c", (40) & 0xff, ((40) >> 8) & 0xff, ((40) >> 16) & 0xff,
                ((40) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((w) & 0xff),
                (OPJ_UINT8)((w) >> 8) & 0xff,
                (OPJ_UINT8)((w) >> 16) & 0xff,
                (OPJ_UINT8)((w) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((h) & 0xff),
                (OPJ_UINT8)((h) >> 8) & 0xff,
                (OPJ_UINT8)((h) >> 16) & 0xff,
                (OPJ_UINT8)((h) >> 24) & 0xff);
        fprintf(fdest, "%c%c", (1) & 0xff, ((1) >> 8) & 0xff);
        fprintf(fdest, "%c%c", (8) & 0xff, ((8) >> 8) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)(h * w + h * (w % 2)) & 0xff,
                (OPJ_UINT8)((h * w + h * (w % 2)) >> 8) &  0xff,
                (OPJ_UINT8)((h * w + h * (w % 2)) >> 16) & 0xff,
                (OPJ_UINT8)((h * w + h * (w % 2)) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (256) & 0xff, ((256) >> 8) & 0xff,
                ((256) >> 16) & 0xff, ((256) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (256) & 0xff, ((256) >> 8) & 0xff,
                ((256) >> 16) & 0xff, ((256) >> 24) & 0xff);

        if (image->comps[0].prec > 8) {
            adjustR = (int)image->comps[0].prec - 8;
            printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n",
                   image->comps[0].prec);
        } else {
            adjustR = 0;
        }

        for (i = 0; i < 256; i++) {
            fprintf(fdest, "%c%c%c%c", i, i, i, 0);
        }

        for (i = 0; i < w * h; i++) {
            int r;

            r = image->comps[0].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            r += (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
            if (adjustR > 0) {
                r = ((r >> adjustR) + ((r >> (adjustR - 1)) % 2));
            }
            if (r > 255) {
                r = 255;
            } else if (r < 0) {
                r = 0;
            }

            fprintf(fdest, "%c", (OPJ_UINT8)r);

            if ((i + 1) % w == 0) {
                for (pad = (w % 4) ? (4 - w % 4) : 0; pad > 0; pad--) { /* ADD */
                    fprintf(fdest, "%c", 0);
                }
            }
        }
        fclose(fdest);
    }

    return 0;
}